

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O0

bool absl::lts_20250127::debugging_internal::DemangleRustSymbolEncoding
               (char *mangled,char *out,size_t out_size)

{
  bool bVar1;
  RustSymbolParser local_1d0;
  size_t local_20;
  size_t out_size_local;
  char *out_local;
  char *mangled_local;
  
  local_20 = out_size;
  out_size_local = (size_t)out;
  out_local = mangled;
  anon_unknown_0::RustSymbolParser::RustSymbolParser(&local_1d0,mangled,out,out + out_size);
  bVar1 = anon_unknown_0::RustSymbolParser::Parse(&local_1d0);
  return bVar1;
}

Assistant:

bool DemangleRustSymbolEncoding(const char* mangled, char* out,
                                size_t out_size) {
  return RustSymbolParser(mangled, out, out + out_size).Parse();
}